

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O2

void __thiscall vkt::Draw::InstancedTests::InstancedTests(InstancedTests *this,TestContext *testCtx)

{
  uint uVar1;
  TestContext *testCtx_00;
  _func_int **pp_Var2;
  ostream *poVar3;
  TestNode *node;
  TestParams param;
  string testName;
  ostringstream string;
  VkPrimitiveTopology VStack_384;
  TestNode *local_380;
  VkPrimitiveTopology local_374;
  long local_370;
  long local_368;
  string local_360;
  string local_340;
  string local_320 [11];
  string local_1a8 [11];
  
  tcu::TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,testCtx,"instanced","Instanced drawing tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstancedTests_00bd79e8;
  local_380 = (TestNode *)this;
  for (local_370 = 0; local_370 != 6; local_370 = local_370 + 1) {
    local_374 = InstancedTests::topologies[local_370];
    local_368 = 0;
    while( true ) {
      if (local_368 == 0x10) break;
      uVar1 = *(uint *)((long)InstancedTests::functions + local_368);
      VStack_384 = local_374;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if ((ulong)uVar1 < 4) {
        std::operator<<((ostream *)local_1a8,
                        &DAT_009a9f94 + *(int *)(&DAT_009a9f94 + (ulong)uVar1 * 4));
      }
      poVar3 = std::operator<<((ostream *)local_1a8,"_");
      de::toString<vk::VkPrimitiveTopology>(&local_360,&VStack_384);
      std::operator<<(poVar3,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)local_320,(string *)&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      node = (TestNode *)operator_new(0xb8);
      testCtx_00 = local_380->m_testCtx;
      de::toLower(local_1a8,&local_340);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_320,"Instanced drawing test",(allocator<char> *)&local_360);
      pp_Var2 = (_func_int **)CONCAT44(VStack_384,uVar1);
      TestCase::TestCase((TestCase *)node,testCtx_00,local_1a8,local_320);
      node->_vptr_TestNode = (_func_int **)&PTR__InstancedDrawCase_00bd7a38;
      node[1]._vptr_TestNode = pp_Var2;
      node[1].m_testCtx = (TestContext *)&node[1].m_name._M_string_length;
      node[1].m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&node[1].m_name._M_string_length = 0;
      *(size_type **)((long)&node[1].m_name.field_2 + 8) = &node[1].m_description._M_string_length;
      node[1].m_description._M_dataplus._M_p = (pointer)0x0;
      *(undefined1 *)&node[1].m_description._M_string_length = 0;
      std::__cxx11::string::assign((char *)&node[1].m_testCtx);
      std::__cxx11::string::assign(node[1].m_name.field_2._M_local_buf + 8);
      tcu::TestNode::addChild(local_380,node);
      std::__cxx11::string::~string((string *)local_320);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string((string *)&local_340);
      local_368 = local_368 + 4;
    }
  }
  return;
}

Assistant:

InstancedTests::InstancedTests(tcu::TestContext& testCtx)
	: TestCaseGroup	(testCtx, "instanced", "Instanced drawing tests")
{
	static const vk::VkPrimitiveTopology	topologies[]			=
	{
		vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
	};
	static const TestParams::DrawFunction	functions[]				=
	{
		TestParams::FUNCTION_DRAW,
		TestParams::FUNCTION_DRAW_INDEXED,
		TestParams::FUNCTION_DRAW_INDIRECT,
		TestParams::FUNCTION_DRAW_INDEXED_INDIRECT,
	};

	for (int topologyNdx = 0; topologyNdx < DE_LENGTH_OF_ARRAY(topologies); topologyNdx++)
	{
		for (int functionNdx = 0; functionNdx < DE_LENGTH_OF_ARRAY(functions); functionNdx++)
		{
			TestParams param;
			param.function = functions[functionNdx];
			param.topology = topologies[topologyNdx];

			std::string testName = de::toString(param);

			addChild(new InstancedDrawCase(m_testCtx, de::toLower(testName), "Instanced drawing test", param));
		}
	}
}